

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O2

int secp256k1_xonly_pubkey_cmp
              (secp256k1_context *ctx,secp256k1_xonly_pubkey *pk0,secp256k1_xonly_pubkey *pk1)

{
  int iVar1;
  uchar (*output32) [32];
  long lVar2;
  secp256k1_xonly_pubkey *pk [2];
  uchar out [2] [32];
  
  if (ctx != (secp256k1_context *)0x0) {
    pk[0] = pk0;
    pk[1] = pk1;
    output32 = out;
    for (lVar2 = 0; lVar2 != 2; lVar2 = lVar2 + 1) {
      iVar1 = secp256k1_xonly_pubkey_serialize(ctx,*output32,pk[lVar2]);
      if (iVar1 == 0) {
        *(uchar *)((long)output32 + 0x10) = '\0';
        *(uchar *)((long)output32 + 0x11) = '\0';
        *(uchar *)((long)output32 + 0x12) = '\0';
        *(uchar *)((long)output32 + 0x13) = '\0';
        *(uchar *)((long)output32 + 0x14) = '\0';
        *(uchar *)((long)output32 + 0x15) = '\0';
        *(uchar *)((long)output32 + 0x16) = '\0';
        *(uchar *)((long)output32 + 0x17) = '\0';
        *(uchar *)((long)output32 + 0x18) = '\0';
        *(uchar *)((long)output32 + 0x19) = '\0';
        *(uchar *)((long)output32 + 0x1a) = '\0';
        *(uchar *)((long)output32 + 0x1b) = '\0';
        *(uchar *)((long)output32 + 0x1c) = '\0';
        *(uchar *)((long)output32 + 0x1d) = '\0';
        *(uchar *)((long)output32 + 0x1e) = '\0';
        *(uchar *)((long)output32 + 0x1f) = '\0';
        *(uchar *)((long)output32 + 0) = '\0';
        *(uchar *)((long)output32 + 1) = '\0';
        *(uchar *)((long)output32 + 2) = '\0';
        *(uchar *)((long)output32 + 3) = '\0';
        *(uchar *)((long)output32 + 4) = '\0';
        *(uchar *)((long)output32 + 5) = '\0';
        *(uchar *)((long)output32 + 6) = '\0';
        *(uchar *)((long)output32 + 7) = '\0';
        *(uchar *)((long)output32 + 8) = '\0';
        *(uchar *)((long)output32 + 9) = '\0';
        *(uchar *)((long)output32 + 10) = '\0';
        *(uchar *)((long)output32 + 0xb) = '\0';
        *(uchar *)((long)output32 + 0xc) = '\0';
        *(uchar *)((long)output32 + 0xd) = '\0';
        *(uchar *)((long)output32 + 0xe) = '\0';
        *(uchar *)((long)output32 + 0xf) = '\0';
      }
      output32 = output32 + 1;
    }
    iVar1 = secp256k1_memcmp_var(out,out + 1,0x20);
    return iVar1;
  }
  fprintf(_stderr,"%s:%d: %s\n",
          "/workspace/llm4binary/github/license_c_cmakelists/bitcoin-core[P]secp256k1/src/modules/extrakeys/main_impl.h"
          ,0x40,"test condition failed: ctx != NULL");
  abort();
}

Assistant:

int secp256k1_xonly_pubkey_cmp(const secp256k1_context* ctx, const secp256k1_xonly_pubkey* pk0, const secp256k1_xonly_pubkey* pk1) {
    unsigned char out[2][32];
    const secp256k1_xonly_pubkey* pk[2];
    int i;

    VERIFY_CHECK(ctx != NULL);
    pk[0] = pk0; pk[1] = pk1;
    for (i = 0; i < 2; i++) {
        /* If the public key is NULL or invalid, xonly_pubkey_serialize will
         * call the illegal_callback and return 0. In that case we will
         * serialize the key as all zeros which is less than any valid public
         * key. This results in consistent comparisons even if NULL or invalid
         * pubkeys are involved and prevents edge cases such as sorting
         * algorithms that use this function and do not terminate as a
         * result. */
        if (!secp256k1_xonly_pubkey_serialize(ctx, out[i], pk[i])) {
            /* Note that xonly_pubkey_serialize should already set the output to
             * zero in that case, but it's not guaranteed by the API, we can't
             * test it and writing a VERIFY_CHECK is more complex than
             * explicitly memsetting (again). */
            memset(out[i], 0, sizeof(out[i]));
        }
    }
    return secp256k1_memcmp_var(out[0], out[1], sizeof(out[1]));
}